

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot.cpp
# Opt level: O1

ImPlotColormap ImPlot::AddColormap(char *name,ImU32 *colormap,int size,bool qual)

{
  ImPlotContext *pIVar1;
  ImGuiID key;
  int iVar2;
  
  pIVar1 = GImPlot;
  if (size < 2) {
    __assert_fail("(size > 1) && \"The colormap size must be greater than 1!\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/implot.cpp"
                  ,0xd02,
                  "ImPlotColormap ImPlot::AddColormap(const char *, const ImU32 *, int, bool)");
  }
  key = ImHashStr(name,0,0);
  iVar2 = ImGuiStorage::GetInt(&(pIVar1->ColormapData).Map,key,-1);
  if (iVar2 == -1) {
    iVar2 = ImPlotColormapData::Append(&pIVar1->ColormapData,name,colormap,size,qual);
    return iVar2;
  }
  __assert_fail("(gp.ColormapData.GetIndex(name) == -1) && \"The colormap name has already be used!\""
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/implot.cpp"
                ,0xd03,"ImPlotColormap ImPlot::AddColormap(const char *, const ImU32 *, int, bool)")
  ;
}

Assistant:

ImPlotColormap AddColormap(const char* name, const ImU32*  colormap, int size, bool qual) {
    ImPlotContext& gp = *GImPlot;
    IM_ASSERT_USER_ERROR(size > 1, "The colormap size must be greater than 1!");
    IM_ASSERT_USER_ERROR(gp.ColormapData.GetIndex(name) == -1, "The colormap name has already be used!");
    return gp.ColormapData.Append(name, colormap, size, qual);
}